

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale.c
# Opt level: O0

MV32 av1_scale_mv(MV *mvq4,int x,int y,scale_factors *sf)

{
  MV32 MVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  scale_factors *in_RCX;
  int in_EDX;
  int in_ESI;
  short *in_RDI;
  int y_off_q4;
  int x_off_q4;
  MV32 res;
  
  iVar2 = av1_scaled_x(in_ESI << 4,in_RCX);
  iVar3 = av1_scaled_y(in_EDX << 4,in_RCX);
  iVar4 = av1_scaled_y(in_EDX * 0x10 + (int)*in_RDI,in_RCX);
  iVar5 = av1_scaled_x(in_ESI * 0x10 + (int)in_RDI[1],in_RCX);
  MVar1.col = iVar5 - iVar2;
  MVar1.row = iVar4 - iVar3;
  return MVar1;
}

Assistant:

MV32 av1_scale_mv(const MV *mvq4, int x, int y,
                  const struct scale_factors *sf) {
  const int x_off_q4 = av1_scaled_x(x << SUBPEL_BITS, sf);
  const int y_off_q4 = av1_scaled_y(y << SUBPEL_BITS, sf);
  const MV32 res = {
    av1_scaled_y((y << SUBPEL_BITS) + mvq4->row, sf) - y_off_q4,
    av1_scaled_x((x << SUBPEL_BITS) + mvq4->col, sf) - x_off_q4
  };
  return res;
}